

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2connection.cpp
# Opt level: O0

void __thiscall
QHttp2Connection::connectionError(QHttp2Connection *this,Http2Error errorCode,char *message)

{
  QLatin1StringView latin1;
  bool bVar1;
  QHttp2Stream *this_00;
  undefined8 in_RDX;
  Http2Error in_ESI;
  QHttp2Connection *in_RDI;
  long in_FS_OFFSET;
  QHttp2Stream *stream;
  add_const_t<QHash<unsigned_int,_QPointer<QHttp2Stream>_>_> *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  QLatin1StringView messageView;
  QLoggingCategoryMacroHolder<(QtMsgType)2> qt_category;
  QLoggingCategory *in_stack_ffffffffffffff28;
  QHttp2Stream *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  Http2Error in_stack_ffffffffffffff3c;
  QHash<unsigned_int,_QPointer<QHttp2Stream>_> *in_stack_ffffffffffffff48;
  QHttp2Stream *this_01;
  undefined4 in_stack_ffffffffffffff60;
  Http2Error HVar2;
  QHttp2Connection *pQVar3;
  char local_38 [32];
  undefined8 local_18;
  ulong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_RDI->m_goingAway & 1U) == 0) {
    local_18 = 0xaaaaaaaaaaaaaaaa;
    local_10 = 0xaaaaaaaaaaaaaaaa;
    pQVar3 = in_RDI;
    qHttp2ConnectionLog();
    anon_unknown.dwarf_621b1d::QLoggingCategoryMacroHolder<(QtMsgType)2>::
    QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)2> *)in_stack_ffffffffffffff30,
               in_stack_ffffffffffffff28);
    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
      anon_unknown.dwarf_621b1d::QLoggingCategoryMacroHolder<(QtMsgType)2>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)2> *)0x2b67c5);
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)in_RDI,
                 (char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                 (int)((ulong)in_stack_ffffffffffffff30 >> 0x20),(char *)in_stack_ffffffffffffff28,
                 (char *)0x2b67de);
      QMessageLogger::critical
                (local_38,"[%p] Connection error: %s (%d)",in_RDI,in_RDX,(ulong)in_ESI);
      local_10 = local_10 & 0xffffffffffffff00;
    }
    in_RDI->m_goingAway = true;
    sendGOAWAY(in_RDI,in_stack_ffffffffffffff3c);
    QLatin1String::QLatin1String
              ((QLatin1String *)in_RDI,
               (char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    QHash<unsigned_int,_QPointer<QHttp2Stream>_>::begin(in_stack_ffffffffffffff48);
    QHash<unsigned_int,_QPointer<QHttp2Stream>_>::end
              ((QHash<unsigned_int,_QPointer<QHttp2Stream>_> *)
               CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    while (bVar1 = QHash<unsigned_int,_QPointer<QHttp2Stream>_>::const_iterator::operator!=
                             ((const_iterator *)
                              CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                              (const_iterator *)in_stack_ffffffffffffff30), bVar1) {
      QHash<unsigned_int,_QPointer<QHttp2Stream>_>::const_iterator::operator*
                ((const_iterator *)0x2b68fd);
      this_00 = QPointer::operator_cast_to_QHttp2Stream_((QPointer<QHttp2Stream> *)0x2b6905);
      if ((this_00 != (QHttp2Stream *)0x0) &&
         (bVar1 = QHttp2Stream::isActive((QHttp2Stream *)this_00), bVar1)) {
        latin1.m_size._4_4_ = in_ESI;
        latin1.m_size._0_4_ = in_stack_ffffffffffffff60;
        latin1.m_data = (char *)pQVar3;
        this_01 = this_00;
        HVar2 = in_ESI;
        QString::QString((QString *)in_RDI,latin1);
        QHttp2Stream::finishWithError
                  (this_01,(Http2Error)((ulong)in_RDI >> 0x20),
                   (QString *)CONCAT44(in_ESI,in_stack_ffffffffffffff38));
        QString::~QString((QString *)0x2b697f);
        in_stack_ffffffffffffff30 = this_00;
        in_stack_ffffffffffffff3c = in_ESI;
        in_ESI = HVar2;
      }
      QHash<unsigned_int,_QPointer<QHttp2Stream>_>::const_iterator::operator++
                ((const_iterator *)in_RDI);
    }
    closeSession((QHttp2Connection *)0x2b699d);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QHttp2Connection::connectionError(Http2Error errorCode, const char *message)
{
    Q_ASSERT(message);
    // RFC 9113, 6.8: An endpoint MAY send multiple GOAWAY frames if circumstances change.
    // Anyway, we do not send multiple GOAWAY frames.
    if (m_goingAway)
        return;

    qCCritical(qHttp2ConnectionLog, "[%p] Connection error: %s (%d)", this, message,
               int(errorCode));

    // RFC 9113, 6.8: Endpoints SHOULD always send a GOAWAY frame before closing a connection so
    // that the remote peer can know whether a stream has been partially processed or not.
    m_goingAway = true;
    sendGOAWAY(errorCode);
    auto messageView = QLatin1StringView(message);

    for (QHttp2Stream *stream : std::as_const(m_streams)) {
        if (stream && stream->isActive())
            stream->finishWithError(errorCode, messageView);
    }

    closeSession();
}